

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O2

bool __thiscall
S2Builder::Graph::GetLeftTurnMap
          (Graph *this,vector<int,_std::allocator<int>_> *in_edge_ids,
          vector<int,_std::allocator<int>_> *left_turn_map,S2Error *error)

{
  __normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_> __first;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar1;
  pointer ppVar2;
  uint uVar3;
  pointer pVVar4;
  pair<int,_int> *ppVar5;
  pointer piVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  __normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_> __i;
  pair<int,_int> *__a;
  __normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_> __last;
  EdgeId *pEVar10;
  uint uVar11;
  int iVar12;
  pair<int,_int> pVar13;
  int *piVar14;
  EdgeId *__x;
  _Vector_base<int,_std::allocator<int>_> *this_00;
  int iVar15;
  int iVar16;
  int iVar17;
  VertexId VVar18;
  ulong uVar19;
  int iVar20;
  bool bVar21;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:271:15)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:271:15)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:271:15)>
  __comp_01;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:271:15)>
  __comp_02;
  Edge sentinel;
  vector<int,_std::allocator<int>_> e_in;
  vector<VertexEdge,_std::allocator<VertexEdge>_> v0_edges;
  vector<int,_std::allocator<int>_> e_out;
  VertexEdge local_100;
  VertexEdge *local_f0;
  int local_e8;
  int local_e4;
  ulong local_e0;
  pair<int,_int> *local_d8;
  pair<int,_int> local_d0;
  _Vector_base<int,_std::allocator<int>_> local_c8;
  _Vector_base<VertexEdge,_std::allocator<VertexEdge>_> local_a8;
  _Vector_base<int,_std::allocator<int>_> local_88;
  S2Error *local_68;
  pair<int,_int> *local_60;
  pair<int,_int> local_58;
  vector<int,_std::allocator<int>_> *local_50;
  int local_44;
  Graph *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_a8._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_a8._M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
  local_68 = error;
  local_50 = left_turn_map;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (left_turn_map,
             (long)(int)((ulong)((long)(this->edges_->
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3),
             (value_type_conflict2 *)&local_a8);
  __a = (this->edges_->
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
        super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->edges_->
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)__a) >> 3) == 0) {
    bVar21 = true;
  }
  else {
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_start = (VertexEdge *)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (VertexEdge *)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8 = __a + *(in_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
    local_d0.first = this->num_vertices_;
    local_100._0_8_ = CONCAT44(local_d8->first,local_d8->second);
    local_d0.second = local_d0.first;
    ppVar5 = std::min<std::pair<int,int>>(__a,(pair<int,_int> *)&local_100);
    pVar13 = *ppVar5;
    uVar19 = (ulong)pVar13 >> 0x20;
    local_e4 = 0;
    local_e8 = 0;
    local_38 = in_edge_ids;
    local_40 = this;
    while( true ) {
      uVar11 = pVar13.first;
      local_f0 = (VertexEdge *)CONCAT44(local_f0._4_4_,uVar11);
      if ((uVar11 == local_d0.first) && ((uint)uVar19 == local_d0.second)) break;
      while( true ) {
        pVVar4 = local_a8._M_impl.super__Vector_impl_data._M_finish;
        pVar13.second = 0;
        pVar13.first = uVar11;
        uVar3 = (uint)local_f0;
        local_e0 = uVar19;
        if (uVar11 != (uint)local_f0) break;
        pvVar1 = this->edges_;
        iVar20 = 0;
        iVar15 = local_e8;
        lVar7 = (long)local_e8 * 8;
        while( true ) {
          uVar11 = (uint)uVar19;
          if ((__a->first != (uint)local_f0) || (__a->second != uVar11)) break;
          ppVar2 = (pvVar1->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          iVar15 = iVar15 + 1;
          __a = (pair<int,_int> *)((long)&ppVar2[1].first + lVar7);
          if (iVar15 == (int)((ulong)((long)(pvVar1->
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppVar2) >> 3)) {
            __a = &local_d0;
          }
          iVar20 = iVar20 + 1;
          lVar7 = lVar7 + 8;
        }
        lVar7 = (long)local_e4;
        lVar8 = lVar7 << 0x20;
        piVar14 = (in_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start + lVar7;
        iVar17 = 0;
        iVar12 = local_e4;
        while ((piVar14 = piVar14 + 1, local_d8->second == (uint)local_f0 &&
               (local_d8->first == uVar11))) {
          ppVar2 = (pvVar1->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          iVar12 = iVar12 + 1;
          local_d8 = &local_d0;
          if (iVar12 != (int)((ulong)((long)(pvVar1->
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppVar2) >> 3)) {
            local_d8 = ppVar2 + *piVar14;
          }
          lVar8 = lVar8 + 0x100000000;
          iVar17 = iVar17 + 1;
        }
        local_60 = __a;
        if ((uint)local_f0 == uVar11) {
          for (; lVar7 < lVar8 >> 0x20; lVar7 = lVar7 + 1) {
            (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar7] = (int)lVar7;
          }
        }
        else {
          iVar9 = 0;
          iVar16 = iVar12;
          for (; iVar20 < iVar17; iVar17 = iVar17 + -1) {
            iVar16 = iVar16 + -1;
            local_100.incoming = true;
            local_100.index = iVar16;
            local_100.endpoint = (VertexId)local_e0;
            local_100.rank = iVar9;
            std::vector<VertexEdge,_std::allocator<VertexEdge>_>::emplace_back<VertexEdge>
                      ((vector<VertexEdge,_std::allocator<VertexEdge>_> *)&local_a8,&local_100);
            iVar9 = iVar9 + 1;
          }
          local_58.first = iVar12;
          local_44 = iVar15;
          iVar20 = local_e8;
          while (iVar15 = local_44, local_e4 < iVar16) {
            local_100._0_8_ = CONCAT44(iVar20,local_100._0_4_) & 0xffffffffffffff00;
            VVar18 = (VertexId)local_e0;
            local_100.endpoint = VVar18;
            local_100.rank = iVar9;
            std::vector<VertexEdge,_std::allocator<VertexEdge>_>::emplace_back<VertexEdge>
                      ((vector<VertexEdge,_std::allocator<VertexEdge>_> *)&local_a8,&local_100);
            local_100.rank = iVar9 + 1;
            iVar16 = iVar16 + -1;
            local_100.incoming = true;
            local_100.index = iVar16;
            local_100.endpoint = VVar18;
            std::vector<VertexEdge,_std::allocator<VertexEdge>_>::emplace_back<VertexEdge>
                      ((vector<VertexEdge,_std::allocator<VertexEdge>_> *)&local_a8,&local_100);
            iVar9 = iVar9 + 2;
            iVar20 = iVar20 + 1;
            iVar12 = local_58.first;
          }
          for (; iVar20 < iVar15; iVar20 = iVar20 + 1) {
            local_100._0_8_ = CONCAT44(iVar20,local_100._0_4_) & 0xffffffffffffff00;
            local_100.endpoint = (VertexId)local_e0;
            local_100.rank = iVar9;
            std::vector<VertexEdge,_std::allocator<VertexEdge>_>::emplace_back<VertexEdge>
                      ((vector<VertexEdge,_std::allocator<VertexEdge>_> *)&local_a8,&local_100);
            iVar9 = iVar9 + 1;
          }
        }
        __a = local_60;
        local_100._0_8_ = CONCAT44(local_d8->first,local_d8->second);
        ppVar5 = std::min<std::pair<int,int>>(local_60,(pair<int,_int> *)&local_100);
        uVar11 = ppVar5->first;
        uVar19 = (ulong)(uint)ppVar5->second;
        in_edge_ids = local_38;
        this = local_40;
        local_e8 = iVar15;
        local_e4 = iVar12;
      }
      if (local_a8._M_impl.super__Vector_impl_data._M_start !=
          local_a8._M_impl.super__Vector_impl_data._M_finish) {
        __first._M_current = local_a8._M_impl.super__Vector_impl_data._M_start + 1;
        local_60 = __a;
        local_58 = pVar13;
        if (__first._M_current != local_a8._M_impl.super__Vector_impl_data._M_finish) {
          VVar18 = (local_a8._M_impl.super__Vector_impl_data._M_start)->endpoint;
          __comp_02._M_comp.min_endpoint = VVar18;
          __comp_02._M_comp.v0 = (uint)local_f0;
          lVar8 = (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                  (long)__first._M_current;
          uVar19 = lVar8 >> 4;
          lVar7 = 0x3f;
          if (uVar19 != 0) {
            for (; uVar19 >> lVar7 == 0; lVar7 = lVar7 + -1) {
            }
          }
          local_f0 = local_a8._M_impl.super__Vector_impl_data._M_start;
          __comp_00._M_comp.this = this;
          __comp_00._M_comp.v0 = uVar3;
          __comp_00._M_comp.min_endpoint = VVar18;
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<VertexEdge*,std::vector<VertexEdge,std::allocator<VertexEdge>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::GetLeftTurnMap(std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>*,S2Error*)const::__0>>
                    (__first,(__normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_>
                              )local_a8._M_impl.super__Vector_impl_data._M_finish,
                     (ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,__comp_00);
          if (lVar8 < 0x101) {
            __comp_02._M_comp.this = this;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<VertexEdge*,std::vector<VertexEdge,std::allocator<VertexEdge>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::GetLeftTurnMap(std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>*,S2Error*)const::__0>>
                      (__first,(__normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_>
                                )pVVar4,__comp_02);
          }
          else {
            __last._M_current = local_f0 + 0x11;
            __comp_01._M_comp.this = this;
            __comp_01._M_comp.v0 = uVar3;
            __comp_01._M_comp.min_endpoint = VVar18;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<VertexEdge*,std::vector<VertexEdge,std::allocator<VertexEdge>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::GetLeftTurnMap(std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>*,S2Error*)const::__0>>
                      (__first,__last,__comp_01);
            for (; __last._M_current != pVVar4; __last._M_current = __last._M_current + 1) {
              __comp._M_comp.this = this;
              __comp._M_comp.v0 = uVar3;
              __comp._M_comp.min_endpoint = VVar18;
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<VertexEdge*,std::vector<VertexEdge,std::allocator<VertexEdge>>>,__gnu_cxx::__ops::_Val_comp_iter<S2Builder::Graph::GetLeftTurnMap(std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>*,S2Error*)const::__0>>
                        (__last,__comp);
            }
          }
        }
        pVVar4 = local_a8._M_impl.super__Vector_impl_data._M_finish;
        for (pEVar10 = &(local_a8._M_impl.super__Vector_impl_data._M_start)->index;
            (VertexEdge *)(pEVar10 + -1) != pVVar4; pEVar10 = pEVar10 + 4) {
          if (((VertexEdge *)(pEVar10 + -1))->incoming == true) {
            this_00 = &local_c8;
            __x = (in_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start + *pEVar10;
LAB_00206afb:
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)this_00,__x);
          }
          else {
            this_00 = &local_88;
            __x = pEVar10;
            if (local_c8._M_impl.super__Vector_impl_data._M_start ==
                local_c8._M_impl.super__Vector_impl_data._M_finish) goto LAB_00206afb;
            piVar14 = local_c8._M_impl.super__Vector_impl_data._M_finish + -1;
            local_c8._M_impl.super__Vector_impl_data._M_finish =
                 local_c8._M_impl.super__Vector_impl_data._M_finish + -1;
            (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[*piVar14] = *pEVar10;
          }
        }
        std::__reverse<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (local_88._M_impl.super__Vector_impl_data._M_start,
                   local_88._M_impl.super__Vector_impl_data._M_finish);
        pVar13 = local_58;
        __a = local_60;
        uVar19 = local_e0;
        while( true ) {
          if ((local_88._M_impl.super__Vector_impl_data._M_finish ==
               local_88._M_impl.super__Vector_impl_data._M_start) ||
             (local_c8._M_impl.super__Vector_impl_data._M_finish ==
              local_c8._M_impl.super__Vector_impl_data._M_start)) break;
          (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_c8._M_impl.super__Vector_impl_data._M_finish[-1]] =
               local_88._M_impl.super__Vector_impl_data._M_finish[-1];
          local_88._M_impl.super__Vector_impl_data._M_finish =
               local_88._M_impl.super__Vector_impl_data._M_finish + -1;
          local_c8._M_impl.super__Vector_impl_data._M_finish =
               local_c8._M_impl.super__Vector_impl_data._M_finish + -1;
        }
        piVar6 = local_c8._M_impl.super__Vector_impl_data._M_start;
        if ((local_c8._M_impl.super__Vector_impl_data._M_finish !=
             local_c8._M_impl.super__Vector_impl_data._M_start) &&
           (piVar6 = local_c8._M_impl.super__Vector_impl_data._M_finish, local_68->code_ == OK)) {
          S2Error::Init(local_68,BUILDER_EDGES_DO_NOT_FORM_LOOPS,
                        "Given edges do not form loops (indegree != outdegree)");
          piVar6 = local_c8._M_impl.super__Vector_impl_data._M_finish;
        }
        if (piVar6 != local_c8._M_impl.super__Vector_impl_data._M_start) {
          local_c8._M_impl.super__Vector_impl_data._M_finish =
               local_c8._M_impl.super__Vector_impl_data._M_start;
        }
        if (local_88._M_impl.super__Vector_impl_data._M_finish !=
            local_88._M_impl.super__Vector_impl_data._M_start) {
          local_88._M_impl.super__Vector_impl_data._M_finish =
               local_88._M_impl.super__Vector_impl_data._M_start;
        }
        if (local_a8._M_impl.super__Vector_impl_data._M_finish !=
            local_a8._M_impl.super__Vector_impl_data._M_start) {
          local_a8._M_impl.super__Vector_impl_data._M_finish =
               local_a8._M_impl.super__Vector_impl_data._M_start;
        }
      }
    }
    bVar21 = local_68->code_ == OK;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
    std::_Vector_base<VertexEdge,_std::allocator<VertexEdge>_>::~_Vector_base(&local_a8);
  }
  return bVar21;
}

Assistant:

bool Graph::GetLeftTurnMap(const vector<EdgeId>& in_edge_ids,
                           vector<EdgeId>* left_turn_map,
                           S2Error* error) const {
  left_turn_map->assign(num_edges(), -1);
  if (num_edges() == 0) return true;

  // Declare vectors outside the loop to avoid reallocating them each time.
  vector<VertexEdge> v0_edges;
  vector<EdgeId> e_in, e_out;

  // Walk through the two sorted arrays of edges (outgoing and incoming) and
  // gather all the edges incident to each vertex.  Then we sort those edges
  // and add an entry to the left turn map from each incoming edge to the
  // immediately following outgoing edge in clockwise order.
  int out = 0, in = 0;
  const Edge* out_edge = &edge(out);
  const Edge* in_edge = &edge(in_edge_ids[in]);
  Edge sentinel(num_vertices(), num_vertices());
  Edge min_edge = min(*out_edge, reverse(*in_edge));
  while (min_edge != sentinel) {
    // Gather all incoming and outgoing edges around vertex "v0".
    VertexId v0 = min_edge.first;
    for (; min_edge.first == v0; min_edge = min(*out_edge, reverse(*in_edge))) {
      VertexId v1 = min_edge.second;
      // Count the number of copies of "min_edge" in each direction.
      int out_begin = out, in_begin = in;
      while (*out_edge == min_edge) {
        out_edge = (++out == num_edges()) ? &sentinel : &edge(out);
      }
      while (reverse(*in_edge) == min_edge) {
        in_edge = (++in == num_edges()) ? &sentinel : &edge(in_edge_ids[in]);
      }
      if (v0 != v1) {
        AddVertexEdges(out_begin, out, in_begin, in, v1, &v0_edges);
      } else {
        // Each degenerate edge becomes its own loop.
        for (; in_begin < in; ++in_begin) {
          (*left_turn_map)[in_begin] = in_begin;
        }
      }
    }
    if (v0_edges.empty()) continue;

    // Sort the edges in clockwise order around "v0".
    VertexId min_endpoint = v0_edges.front().endpoint;
    std::sort(v0_edges.begin() + 1, v0_edges.end(),
              [v0, min_endpoint, this](const VertexEdge& a,
                                       const VertexEdge& b) {
        if (a.endpoint == b.endpoint) return a.rank < b.rank;
        if (a.endpoint == min_endpoint) return true;
        if (b.endpoint == min_endpoint) return false;
        return !s2pred::OrderedCCW(vertex(a.endpoint), vertex(b.endpoint),
                                   vertex(min_endpoint), vertex(v0));
      });
    // Match incoming with outgoing edges.  We do this by keeping a stack of
    // unmatched incoming edges.  We also keep a stack of outgoing edges with
    // no previous incoming edge, and match these at the end by wrapping
    // around circularly to the start of the edge ordering.
    for (const VertexEdge& e : v0_edges) {
      if (e.incoming) {
        e_in.push_back(in_edge_ids[e.index]);
      } else if (!e_in.empty()) {
        (*left_turn_map)[e_in.back()] = e.index;
        e_in.pop_back();
      } else {
        e_out.push_back(e.index);  // Matched below.
      }
    }
    // Pair up additional edges using the fact that the ordering is circular.
    std::reverse(e_out.begin(), e_out.end());
    for (; !e_out.empty() && !e_in.empty(); e_out.pop_back(), e_in.pop_back()) {
      (*left_turn_map)[e_in.back()] = e_out.back();
    }
    // We only need to process unmatched incoming edges, since we are only
    // responsible for creating left turn map entries for those edges.
    if (!e_in.empty() && error->ok()) {
      error->Init(S2Error::BUILDER_EDGES_DO_NOT_FORM_LOOPS,
                  "Given edges do not form loops (indegree != outdegree)");
    }
    e_in.clear();
    e_out.clear();
    v0_edges.clear();
  }
  return error->ok();
}